

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

C * __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::createBuffer
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,size_t length,bool saveContents
          )

{
  size_t sVar1;
  undefined1 *puVar2;
  BufHdr *pBVar3;
  BufHdr *pBVar4;
  BufHdr *dst;
  byte in_DL;
  BufHdr *in_RSI;
  long *in_RDI;
  size_t copyLength;
  C *p;
  Ptr<axl::rc::BufHdr> hdr;
  size_t bufferSize;
  size_t size;
  BufHdr *in_stack_ffffffffffffff68;
  BufHdr *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  Ptr local_40 [16];
  size_t local_30;
  undefined1 *local_28;
  byte local_19;
  BufHdr *local_18;
  BufHdr *local_8;
  
  local_19 = in_DL & 1;
  local_28 = (undefined1 *)((long)&(in_RSI->super_RefCount)._vptr_RefCount + 1);
  local_18 = in_RSI;
  if (((in_RDI[1] != 0) && (local_28 <= *(undefined1 **)(in_RDI[1] + 0x18))) &&
     (sVar1 = rc::RefCount::getRefCount((RefCount *)in_RDI[1]), sVar1 == 1)) {
    if ((in_RDI[2] == 0) || ((local_19 & 1) == 0)) {
      *in_RDI = in_RDI[1] + 0x28;
    }
    puVar2 = (undefined1 *)
             rc::BufHdr::getLeftoverBufferSize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (local_28 <= puVar2) {
      in_RDI[2] = (long)local_18;
      *(undefined1 *)((long)&(local_18->super_RefCount)._vptr_RefCount + *in_RDI) = 0;
      *(undefined1 *)(in_RDI + 3) = 1;
      return (C *)*in_RDI;
    }
  }
  local_30 = getAllocSize(0x126803);
  pBVar3 = (BufHdr *)mem::allocate(0x126816);
  rc::BufHdr::BufHdr(pBVar3,in_stack_ffffffffffffff78,(uintptr_t)in_stack_ffffffffffffff70);
  rc::primeRefCount<axl::rc::BufHdr>
            (in_stack_ffffffffffffff70,(FreeFunc *)in_stack_ffffffffffffff68);
  rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>
            ((Ptr<axl::rc::BufHdr> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
  if (pBVar4 == (BufHdr *)0x0) {
    local_8 = (BufHdr *)0x0;
  }
  else {
    pBVar4 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
    dst = pBVar4 + 1;
    if (((local_19 & 1) != 0) && (*in_RDI != 0)) {
      in_stack_ffffffffffffff70 = local_18;
      if ((BufHdr *)in_RDI[2] <= local_18) {
        in_stack_ffffffffffffff70 = (BufHdr *)in_RDI[2];
      }
      StringDetailsImpl<char>::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)*in_RDI);
    }
    if (in_RDI[1] != 0) {
      rc::RefCount::release(&in_stack_ffffffffffffff70->super_RefCount);
    }
    *(undefined1 *)
     ((long)&(dst->super_RefCount)._vptr_RefCount + (long)&(local_18->super_RefCount)._vptr_RefCount
     ) = 0;
    *in_RDI = (long)dst;
    pBVar3 = rc::Ptr<axl::rc::BufHdr>::detach((Ptr<axl::rc::BufHdr> *)pBVar3,(RefCount **)pBVar4);
    in_RDI[1] = (long)pBVar3;
    in_RDI[2] = (long)local_18;
    *(undefined1 *)(in_RDI + 3) = 1;
    local_8 = dst;
  }
  rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x1269b3);
  return (C *)local_8;
}

Assistant:

C*
	createBuffer(
		size_t length,
		bool saveContents = false
	) {
		size_t size = (length + 1) * sizeof(C);

		if (this->m_hdr &&
			this->m_hdr->m_bufferSize >= size &&
			this->m_hdr->getRefCount() == 1) {
			if (!this->m_length || !saveContents)
				this->m_p = (C*)(this->m_hdr + 1);

			if (this->m_hdr->getLeftoverBufferSize(this->m_p) >= size) {
				this->m_length = length;
				this->m_p[length] = 0;
				this->m_isNullTerminated = true;
				return this->m_p;
			}
		}

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<rc::BufHdr> hdr = AXL_RC_NEW_ARGS_EXTRA(rc::BufHdr, (bufferSize), bufferSize);
		if (!hdr)
			return NULL;

		C* p = (C*)(hdr + 1);

		if (saveContents && this->m_p) {
			size_t copyLength = AXL_MIN(length, this->m_length);
			Details::copy(p, this->m_p, copyLength);
		}

		if (this->m_hdr)
			this->m_hdr->release();

		p[length] = 0; // ensure zero termination

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_length = length;
		this->m_isNullTerminated = true;
		return p;
	}